

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void draw_uniques(int *array,size_t length,int min,int max)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (length != 0) {
    uVar3 = 0;
    do {
      iVar1 = rand();
      iVar1 = iVar1 % (max - min) + min;
      array[uVar3] = iVar1;
      if (uVar3 != 0) {
        uVar2 = 0;
        do {
          if (array[uVar2] == iVar1) goto LAB_00101205;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
      uVar3 = uVar3 + 1;
LAB_00101205:
    } while (uVar3 < length);
  }
  return;
}

Assistant:

void draw_uniques(int* array, const size_t length, const int min, const int max) {
  for (size_t n = 0; n < length; n++) {
    array[n] = rand() % (max - min) + min;
    for (size_t o = 0; o < n; o++) {
      if (array[o] == array[n]) {
        // Decrement and loop over
        n--;
        break;
      }
    }
  }
}